

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_SeeJSON.c
# Opt level: O3

void test_for_access_string(void)

{
  json_node node;
  anon_union_16_4_9ecb9ae1_for_value local_30;
  undefined4 local_20;
  code *local_18;
  
  local_20 = 0;
  local_18 = getValue;
  json_free((json_node *)&local_30.object);
  local_30.object.member = (json_member *)malloc(1);
  *local_30.string.value = '\0';
  local_30.object.size = 0;
  cases_total = cases_total + 1;
  local_20 = 4;
  cases_passed = cases_passed + 1;
  json_free((json_node *)&local_30.object);
  local_30.object.member = (json_member *)malloc(6);
  *(undefined4 *)&(local_30.object.member)->key = 0x6c6c6568;
  cases_total = cases_total + 1;
  *(undefined2 *)((long)&(local_30.object.member)->key + 4) = 0x6f;
  local_30.object.size = 5;
  local_20 = 4;
  if (*(short *)((long)&(local_30.object.member)->key + 4) == 0x6f &&
      *(int *)&(local_30.object.member)->key == 0x6c6c6568) {
    cases_passed = cases_passed + 1;
  }
  else {
    test_for_access_string_cold_1();
  }
  json_free((json_node *)&local_30.object);
  return;
}

Assistant:

static void test_for_access_string()
{
    json_node node;
    json_init(&node);
    json_set_string(&node,"",0);
    TEST_STRING_IS_RIGHT("",json_get_string(&node),json_get_string_length(&node));
    json_set_string(&node,"hello",5);
    TEST_STRING_IS_RIGHT("hello",json_get_string(&node),json_get_string_length(&node));
    json_free(&node);
}